

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf_group_start(size_t num_tests)

{
  cm_message_output cVar1;
  cm_message_output output;
  
  cVar1 = cm_get_output();
  switch(cVar1) {
  case CM_OUTPUT_STDOUT:
    cmprintf_group_start_standard(0x18db0e);
    break;
  case CM_OUTPUT_SUBUNIT:
    break;
  case CM_OUTPUT_TAP:
    cmprintf_group_start_tap(0x18db1c);
    break;
  case CM_OUTPUT_XML:
  }
  return;
}

Assistant:

static void cmprintf_group_start(const size_t num_tests)
{
    enum cm_message_output output;

    output = cm_get_output();

    switch (output) {
    case CM_OUTPUT_STDOUT:
        cmprintf_group_start_standard(num_tests);
        break;
    case CM_OUTPUT_SUBUNIT:
        break;
    case CM_OUTPUT_TAP:
        cmprintf_group_start_tap(num_tests);
        break;
    case CM_OUTPUT_XML:
        break;
    }
}